

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaxi.c
# Opt level: O2

Vec_Int_t *
Gia_ManMaxiTest(Gia_Man_t *p,Vec_Int_t *vInit0,int nFrames,int nWords,int nTimeOut,int fSim,
               int fVerbose)

{
  Vec_Int_t *vInit;
  Vec_Int_t *pVVar1;
  
  vInit = vInit0;
  if (vInit0 == (Vec_Int_t *)0x0) {
    vInit = Vec_IntStart(p->nRegs);
  }
  pVVar1 = Gia_ManMaxiPerform(p,vInit,nFrames,nTimeOut,fVerbose);
  if (vInit != vInit0) {
    Vec_IntFree(vInit);
  }
  return pVVar1;
}

Assistant:

Vec_Int_t * Gia_ManMaxiTest( Gia_Man_t * p, Vec_Int_t * vInit0, int nFrames, int nWords, int nTimeOut, int fSim, int fVerbose )
{
    Vec_Int_t * vRes, * vInit;
    vInit = vInit0 ? vInit0 : Vec_IntStart( Gia_ManRegNum(p) );
    vRes = Gia_ManMaxiPerform( p, vInit, nFrames, nTimeOut, fVerbose );
    if ( vInit != vInit0 )
        Vec_IntFree( vInit );
    return vRes;
}